

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpConnection.cpp
# Opt level: O0

ssize_t __thiscall
sznet::net::KcpConnection::send(KcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  bool bVar1;
  KcpConnection *extraout_RAX;
  undefined4 in_register_00000034;
  StringPiece local_a8 [2];
  KcpConnection *local_88;
  type local_80;
  Functor local_48;
  code *local_28;
  offset_in_KcpConnection_to_subr fp;
  StringPiece *local_18;
  StringPiece *message_local;
  KcpConnection *this_local;
  
  local_18 = (StringPiece *)CONCAT44(in_register_00000034,__fd);
  if (this->m_state == kConnected) {
    message_local = (StringPiece *)this;
    bVar1 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar1) {
      sendInLoop(this,local_18);
      this = extraout_RAX;
    }
    else {
      local_28 = sendInLoop;
      fp = 0;
      this_00 = this->m_loop;
      local_88 = this;
      StringPiece::as_string_abi_cxx11_(local_a8);
      std::
      bind<void(sznet::net::KcpConnection::*&)(sznet::StringPiece_const&),sznet::net::KcpConnection*,std::__cxx11::string>
                (&local_80,(offset_in_KcpConnection_to_subr *)&local_28,&local_88,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
      std::function<void()>::
      function<std::_Bind<void(sznet::net::KcpConnection::*(sznet::net::KcpConnection*,std::__cxx11::string))(sznet::StringPiece_const&)>,void>
                ((function<void()> *)&local_48,&local_80);
      EventLoop::runInLoop(this_00,&local_48);
      std::function<void_()>::~function(&local_48);
      std::
      _Bind<void_(sznet::net::KcpConnection::*(sznet::net::KcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>
      ::~_Bind(&local_80);
      this = (KcpConnection *)std::__cxx11::string::~string((string *)local_a8);
    }
  }
  return (ssize_t)this;
}

Assistant:

void KcpConnection::send(const StringPiece& message)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(message);
		}
		else
		{
			void (KcpConnection:: * fp)(const StringPiece & message) = &KcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, message.as_string()));
		}
	}
}